

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::GenerateBlockSyntax::isChildOptional(size_t index)

{
  size_t index_local;
  undefined1 local_1;
  
  if (index == 1) {
    local_1 = true;
  }
  else if (index == 3) {
    local_1 = true;
  }
  else if (index == 6) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool GenerateBlockSyntax::isChildOptional(size_t index) {
    switch (index) {
        case 1: return true;
        case 3: return true;
        case 6: return true;
        default: return false;
    }
}